

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfImage.cpp
# Opt level: O0

void __thiscall Imf_3_2::Image::eraseChannel(Image *this,string *name)

{
  bool bVar1;
  iterator __position;
  long lVar2;
  ImageLevel **ppIVar3;
  undefined8 in_RSI;
  long in_RDI;
  iterator i;
  int x;
  int y;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo>_>_>
  *in_stack_ffffffffffffffa8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo>_>_>
  *in_stack_ffffffffffffffb0;
  _Self local_28;
  _Self local_20;
  int local_18;
  int local_14;
  undefined8 local_10;
  
  local_14 = 0;
  local_10 = in_RSI;
  while( true ) {
    __position._M_node = (_Base_ptr)(long)local_14;
    lVar2 = Array2D<Imf_3_2::ImageLevel_*>::height
                      ((Array2D<Imf_3_2::ImageLevel_*> *)(in_RDI + 0x50));
    if (lVar2 <= (long)__position._M_node) break;
    local_18 = 0;
    while( true ) {
      in_stack_ffffffffffffffb0 =
           (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo>_>_>
            *)(long)local_18;
      lVar2 = Array2D<Imf_3_2::ImageLevel_*>::width
                        ((Array2D<Imf_3_2::ImageLevel_*> *)(in_RDI + 0x50));
      if (lVar2 <= (long)in_stack_ffffffffffffffb0) break;
      ppIVar3 = Array2D<Imf_3_2::ImageLevel_*>::operator[]
                          ((Array2D<Imf_3_2::ImageLevel_*> *)(in_RDI + 0x50),(long)local_14);
      if (ppIVar3[local_18] != (ImageLevel *)0x0) {
        ppIVar3 = Array2D<Imf_3_2::ImageLevel_*>::operator[]
                            ((Array2D<Imf_3_2::ImageLevel_*> *)(in_RDI + 0x50),(long)local_14);
        (*ppIVar3[local_18]->_vptr_ImageLevel[5])(ppIVar3[local_18],local_10);
      }
      local_18 = local_18 + 1;
    }
    local_14 = local_14 + 1;
  }
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo>_>_>
       ::find(in_stack_ffffffffffffffa8,(key_type *)0x133050);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo>_>_>
       ::end(in_stack_ffffffffffffffa8);
  bVar1 = std::operator!=(&local_20,&local_28);
  if (bVar1) {
    std::
    map<std::__cxx11::string,Imf_3_2::Image::ChannelInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Imf_3_2::Image::ChannelInfo>>>
    ::erase_abi_cxx11_(in_stack_ffffffffffffffb0,__position);
  }
  return;
}

Assistant:

void
Image::eraseChannel (const std::string& name)
{
    //
    // Note: eraseChannel() is called to clean up if an exception is
    // thrown during a call during insertChannel(), so eraseChannel()
    // must work correctly even after an incomplete insertChannel()
    // operation.
    //

    for (int y = 0; y < _levels.height (); ++y)
        for (int x = 0; x < _levels.width (); ++x)
            if (_levels[y][x]) _levels[y][x]->eraseChannel (name);

    ChannelMap::iterator i = _channels.find (name);

    if (i != _channels.end ()) _channels.erase (i);
}